

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.h
# Opt level: O0

uint8_t * quicly_encode64(uint8_t *p,uint64_t v)

{
  uint64_t v_local;
  uint8_t *p_local;
  
  *p = (uint8_t)(v >> 0x38);
  p[1] = (uint8_t)(v >> 0x30);
  p[2] = (uint8_t)(v >> 0x28);
  p[3] = (uint8_t)(v >> 0x20);
  p[4] = (uint8_t)(v >> 0x18);
  p[5] = (uint8_t)(v >> 0x10);
  p[6] = (uint8_t)(v >> 8);
  p[7] = (uint8_t)v;
  return p + 8;
}

Assistant:

inline uint8_t *quicly_encode64(uint8_t *p, uint64_t v)
{
    *p++ = (uint8_t)(v >> 56);
    *p++ = (uint8_t)(v >> 48);
    *p++ = (uint8_t)(v >> 40);
    *p++ = (uint8_t)(v >> 32);
    *p++ = (uint8_t)(v >> 24);
    *p++ = (uint8_t)(v >> 16);
    *p++ = (uint8_t)(v >> 8);
    *p++ = (uint8_t)v;
    return p;
}